

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O2

char * S2::internal::GetIntersectionMethodName(IntersectionMethod method)

{
  if (method < NUM_METHODS) {
    return &DAT_002a9cd0 + *(int *)(&DAT_002a9cd0 + (ulong)method * 4);
  }
  return "Unknown";
}

Assistant:

const char* GetIntersectionMethodName(IntersectionMethod method) {
  switch (method) {
    case IntersectionMethod::SIMPLE:    return "Simple";
    case IntersectionMethod::SIMPLE_LD: return "Simple_ld";
    case IntersectionMethod::STABLE:    return "Stable";
    case IntersectionMethod::STABLE_LD: return "Stable_ld";
    case IntersectionMethod::EXACT:     return "Exact";
    default:                            return "Unknown";
  }
}